

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

int glfwExtensionSupported(char *extension)

{
  int iVar1;
  GLFWbool GVar2;
  char *pcVar3;
  char *extensions;
  char *en;
  GLint count;
  int i;
  _GLFWwindow *window;
  char *extension_local;
  
  window = (_GLFWwindow *)extension;
  if (extension == (char *)0x0) {
    __assert_fail("extension != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/src/context.c"
                  ,0x2a4,"int glfwExtensionSupported(const char *)");
  }
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    extension_local._4_4_ = 0;
  }
  else {
    _count = _glfwPlatformGetTls(&_glfw.contextSlot);
    if (_count == (void *)0x0) {
      _glfwInputError(0x10002,"Cannot query extension without a current OpenGL or OpenGL ES context"
                     );
      extension_local._4_4_ = 0;
    }
    else if (*(char *)&window->next == '\0') {
      _glfwInputError(0x10004,"Extension name cannot be an empty string");
      extension_local._4_4_ = 0;
    }
    else {
      if (*(int *)((long)_count + 0x210) < 3) {
        pcVar3 = (char *)(**(code **)((long)_count + 0x248))(0x1f03);
        if (pcVar3 == (char *)0x0) {
          _glfwInputError(0x10008,"Extension string retrieval is broken");
          return 0;
        }
        GVar2 = _glfwStringInExtensionString((char *)window,pcVar3);
        if (GVar2 != 0) {
          return 1;
        }
      }
      else {
        (**(code **)((long)_count + 0x240))(0x821d,&en);
        for (en._4_4_ = 0; en._4_4_ < (int)en; en._4_4_ = en._4_4_ + 1) {
          pcVar3 = (char *)(**(code **)((long)_count + 0x238))(0x1f03,en._4_4_);
          if (pcVar3 == (char *)0x0) {
            _glfwInputError(0x10008,"Extension string retrieval is broken");
            return 0;
          }
          iVar1 = strcmp(pcVar3,(char *)window);
          if (iVar1 == 0) {
            return 1;
          }
        }
      }
      extension_local._4_4_ = (**(code **)((long)_count + 0x268))(window);
    }
  }
  return extension_local._4_4_;
}

Assistant:

GLFWAPI int glfwExtensionSupported(const char* extension)
{
    _GLFWwindow* window;
    assert(extension != NULL);

    _GLFW_REQUIRE_INIT_OR_RETURN(GLFW_FALSE);

    window = _glfwPlatformGetTls(&_glfw.contextSlot);
    if (!window)
    {
        _glfwInputError(GLFW_NO_CURRENT_CONTEXT,
                        "Cannot query extension without a current OpenGL or OpenGL ES context");
        return GLFW_FALSE;
    }

    if (*extension == '\0')
    {
        _glfwInputError(GLFW_INVALID_VALUE, "Extension name cannot be an empty string");
        return GLFW_FALSE;
    }

    if (window->context.major >= 3)
    {
        int i;
        GLint count;

        // Check if extension is in the modern OpenGL extensions string list

        window->context.GetIntegerv(GL_NUM_EXTENSIONS, &count);

        for (i = 0;  i < count;  i++)
        {
            const char* en = (const char*)
                window->context.GetStringi(GL_EXTENSIONS, i);
            if (!en)
            {
                _glfwInputError(GLFW_PLATFORM_ERROR,
                                "Extension string retrieval is broken");
                return GLFW_FALSE;
            }

            if (strcmp(en, extension) == 0)
                return GLFW_TRUE;
        }
    }
    else
    {
        // Check if extension is in the old style OpenGL extensions string

        const char* extensions = (const char*)
            window->context.GetString(GL_EXTENSIONS);
        if (!extensions)
        {
            _glfwInputError(GLFW_PLATFORM_ERROR,
                            "Extension string retrieval is broken");
            return GLFW_FALSE;
        }

        if (_glfwStringInExtensionString(extension, extensions))
            return GLFW_TRUE;
    }

    // Check if extension is in the platform-specific string
    return window->context.extensionSupported(extension);
}